

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeSetMaxNonlinIters(void *cvode_mem,int maxcor)

{
  int iVar1;
  int iVar2;
  int error_code;
  undefined4 in_register_00000034;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar2 = -0x15;
    error_code = -0x15;
    iVar1 = 0x31b;
  }
  else {
    if (*(long *)((long)cvode_mem + 0x3d0) != 0) {
      iVar1 = SUNNonlinSolSetMaxIters
                        (*(long *)((long)cvode_mem + 0x3d0),CONCAT44(in_register_00000034,maxcor));
      return iVar1;
    }
    msgfmt = "A memory request failed.";
    iVar2 = -0x14;
    error_code = -0x14;
    iVar1 = 0x323;
  }
  cvProcessError((CVodeMem)0x0,error_code,iVar1,"CVodeSetMaxNonlinIters",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVodeSetMaxNonlinIters(void* cvode_mem, int maxcor)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->NLS == NULL)
  {
    cvProcessError(NULL, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  return (SUNNonlinSolSetMaxIters(cv_mem->NLS, maxcor));
}